

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O0

void HTTPHeaders_Free(HTTP_HEADERS_HANDLE handle)

{
  HTTP_HEADERS_HANDLE_DATA *handleData;
  HTTP_HEADERS_HANDLE handle_local;
  
  if (handle != (HTTP_HEADERS_HANDLE)0x0) {
    Map_Destroy(handle->headers);
    free(handle);
  }
  return;
}

Assistant:

void HTTPHeaders_Free(HTTP_HEADERS_HANDLE handle)
{
    /*Codes_SRS_HTTP_HEADERS_02_001: [If httpHeadersHandle is NULL then HTTPHeaders_Free shall perform no action.] */
    if (handle == NULL)
    {
        /*do nothing*/
    }
    else
    {
        /*Codes_SRS_HTTP_HEADERS_99_005:[ Calling this API shall de-allocate the data structures allocated by previous API calls to the same handle.]*/
        HTTP_HEADERS_HANDLE_DATA* handleData = (HTTP_HEADERS_HANDLE_DATA*)handle;

        Map_Destroy(handleData->headers);
        free(handleData);
    }
}